

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primality-test-baseline.c
# Opt level: O1

int gaIIsPrimeStrongFermat(uint64_t n,uint64_t a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  
  iVar5 = 2;
  if (a % n != 0) {
    uVar6 = n - 1;
    if (uVar6 == 0) {
      lVar7 = 0x40;
    }
    else {
      lVar7 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
        }
      }
    }
    uVar4 = gaIPowMod(a % n,uVar6 >> ((byte)lVar7 & 0x3f),n);
    if (uVar4 != uVar6 && uVar4 != 1) {
      if (1 < (uint)lVar7) {
        lVar7 = lVar7 + -1;
        do {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar4;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar4;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = n;
          uVar4 = SUB168((auVar2 * auVar3) % auVar1,0);
          if (uVar4 == 1) break;
          if (uVar4 == uVar6) {
            return 2;
          }
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int      gaIIsPrimeStrongFermat(uint64_t n, uint64_t a){
	/**
	 * The Fermat strong probable prime test the Miller-Rabin test relies upon
	 * uses integer "witnesses" in an attempt at proving the number composite.
	 * Should it fail to prove an integer composite, it reports the number as
	 * "probably prime". However, if the witnesses are chosen carefully, the
	 * Miller-Rabin test can be made deterministic below a chosen threshold.
	 *
	 * One can use the primes 2 to 37 in order to ensure the correctness of the
	 * identifications for integers under 2^64.
	 *
	 * Jim Sinclair has found that the seven witnesses
	 *     2, 325, 9375, 28178, 450775, 9780504, 1795265022
	 * also deterministically classify all integers <2^64.
	 *
	 *
	 * The Fermat strong probable prime test states that, for integers
	 *             n = d*2^s+1,  d odd, s integer >= 0
	 *             a             integer (chosen witness)
	 * n is a Fermat strong probable prime if
	 *     a^(d    ) =  1 mod n       or
	 *     a^(d*2^r) = -1 mod n       for any integer r, 0 <= r < s.
	 *
	 *
	 * The justification for this comes from Fermat's Little Theorem: If n is
	 * prime and a is any integer, then the following always holds:
	 *           a^n =  a mod n
	 * If n is prime and a is coprime to n, then the following always holds:
	 *       a^(n-1) =  1 mod n
	 *
	 *
	 * In effect, the logic goes
	 *
	 *   A:   The number  n  is prime.                               (Statement)
	 *   B:   The number  n  does not divide a.                      (Statement)
	 *   C:   a^(  n-1)       =  1 mod n                             (Statement)
	 *   D:   The commutative ring Z/nZ is a finite field.           (Statement)
	 *   E:   Finite fields are unique factorization domains.        (Statement)
	 *   F:   x^2 = 1 mod n factorizes as (x+1)(x-1) = 0 mod n.      (Statement)
	 *   G:   x^2 mod n only has the trivial square roots 1 and -1   (Statement)
	 *   H:   The number  n  is odd and >= 3.                        (Statement)
	 *   I:   The number n-1 equals d*2^s, with d,s int > 0, d odd.  (Statement)
	 *   J:   a^(    d)       =   1 mod n                            (Statement)
	 *   K:   a^(d*2^r)       =  -1 mod n   for some 0 <= r < s.     (Statement)
	 *   L:   a^(d*2^(r+1))   =   1 mod n   for some 0 <= r < s.     (Statement)
	 *   M:   a^(d*2^r)      != +-1 mod n   AND                      (Statement)
	 *        a^(d*2^(r+1))   =   1 mod n   for some 0 <= r < s.
	 *
	 *   A&B           -->  C                 (Proposition:     Fermat's Little Theorem)
	 *   !C            -->  !(A&B) = !A|!B    (Contrapositive:  Fermat's Little Theorem)
	 *   A             <->  D                 (Proposition)
	 *   E                                    (Proposition:     By definition)
	 *   F                                    (Proposition:     x^2-x+x-1 = x^2-1 mod n)
	 *   D&E&F         -->  G                 (Proposition:     (x+1)(x-1) is the only
	 *                                                           factorization)
	 *   !G            -->  !D|!E|!F          (Contrapositive:  See above)
	 *   H&I&J         -->  C                 (Proposition:     Squaring  1 gives 1)
	 *   H&I&K         -->  L                 (Proposition:     Squaring -1 gives 1)
	 *   H&I&L         -->  C                 (Proposition:     1, squared or not, gives 1)
	 *   H&I&K         -->  C                 (Hypothetical Syllogism)
	 *   H&I&(J|K)     -->  C                 (Union)
	 *   H&I&!(J|K)    -->  M|!C              (Proposition:     Either squaring
	 *                                                            a^(d*2^(s-1)) != +-1 mod n
	 *                                                          gives a 1, in which case
	 *                                                          M holds, or it does not
	 *                                                          give 1 and therefore
	 *                                                            a^(n-1) != 1 mod n)
	 *                                                          and thus !C holds.
	 *   H&I&!(J|K)    -->  H&I&M | !A | !B   (Absorbtion, Hypothetical Syllogism)
	 *   H&I&M         -->  !G                (Proposition:     x^2 = 1 mod n but x!=+1,
	 *                                                          so x^2 - 1 has roots
	 *                                                          other than +-1)
	 *   H&I&M         -->  !D|!E|!F          (Modus Tollens)
	 *   H&I&M         -->  !D                (Disjunctive Syllogism)
	 *   H&I&M         -->  !A                (Biconditional)
	 *   H&I&!(J|K)    -->  !A | !A | !B      (Hypothethical Syllogism)
	 *   H&I&!(J|K)&B  -->  !A | !A           (Absorbtion)
	 *   H&I&!(J|K)&B  -->  !A | !A           (Disjunctive Syllogism)
	 *   H&I&!(J|K)&B  -->  !A                (Disjunctive Simplification)
	 *                           ***** Conclusions: *****
	 *                            H&I&M         -->  !A
	 *                            H&I&!(J|K)&B  -->  !A
	 *
	 * Broadly speaking, what the above tells us is:
	 *   - We can't prove n prime (A), but we can prove it composite (!A).
	 *   - Either H&I&M or H&I&!(J|K)&B prove compositeness.
	 *   - If H&I&(J|K) for any r, then we've proven C true. If we prove C true,
	 *     we can't use the contrapositive of Fermat's Little Theorem, so no
	 *     conclusions about the truth-value of A can be made. The test is
	 *     inconclusive. Thus this function returns "probably prime".
	 */

	uint64_t d, x;
	int64_t  s, r;

	a %= n;
	if(a==0){
		return GA_IS_PROBABLY_PRIME;
	}

	s  = gaICtz(n-1);
	d  = (n-1) >> s;
	x  = gaIPowMod(a,d,n);

	if(x==1 || x==n-1){
		return GA_IS_PROBABLY_PRIME;
	}

	for(r=0;r<s-1;r++){
		x = gaIMulMod(x,x,n);
		if(x==1){
			return GA_IS_COMPOSITE;
		}else if(x == n-1){
			return GA_IS_PROBABLY_PRIME;
		}
	}

	return GA_IS_COMPOSITE;
}